

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::sendCommand(FederateState *this,ActionMessage *command)

{
  ulong uVar1;
  string_viewOps *__n_00;
  byte *__s;
  size_t __n_01;
  ulong *__s1;
  LogManager *pLVar2;
  string_view quoteChars;
  pointer pbVar3;
  pointer pbVar4;
  _Alloc_hider __src;
  int iVar5;
  void *pvVar6;
  string *psVar7;
  char *in_RCX;
  unsigned_long uVar8;
  char *extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar9;
  size_type __rlen;
  size_type __n;
  double dVar10;
  string_view V;
  string_view V_00;
  string_view V_01;
  string_view V_02;
  string_view trimCharacters;
  string_view line;
  string_view str;
  string_view str_00;
  string_view logMessageSource;
  string_view fmt;
  string_view str_01;
  string_view str_02;
  string_view fmt_00;
  string_view str_03;
  string_view str_04;
  string_view message;
  format_args args;
  format_args args_00;
  string_viewVector res;
  ActionMessage barrier;
  delimiter_compression in_stack_fffffffffffffea8;
  string_viewVector local_148;
  string local_130;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  ActionMessage local_100;
  pointer local_48;
  size_type sStack_40;
  
  __n_00 = (string_viewOps *)(command->payload).bufferSize;
  __s = (command->payload).heap;
  local_110._M_len = (size_t)__n_00;
  local_110._M_str = (char *)__s;
  if (__n_00 != (string_viewOps *)0x0) {
    pvVar6 = memchr(__s,0x23,(size_t)__n_00);
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pvVar6 == (void *)0x0);
    if (((long)pvVar6 - (long)__s != -1 && pvVar6 != (void *)0x0) &&
       (local_110._M_len = ((long)pvVar6 - (long)__s) - 1, __n_00 < local_110._M_len)) {
      local_110._M_len = (size_t)__n_00;
    }
  }
  trimCharacters._M_str = in_RCX;
  trimCharacters._M_len = (size_t)" \t\n\r";
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&local_110,(string_view *)0x4,trimCharacters);
  aVar9.values_ = (value<fmt::v11::context> *)0x0;
  quoteChars._M_str = (char *)0x4499aa;
  quoteChars._M_len = 3;
  line._M_str = (char *)0x1;
  line._M_len = (size_t)local_110._M_str;
  gmlc::utilities::string_viewOps::splitlineQuotes
            (&local_148,(string_viewOps *)local_110._M_len,line,(string_view)ZEXT816(0x41cc02),
             quoteChars,in_stack_fffffffffffffea8);
  pbVar4 = local_148.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = local_148.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_148.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_148.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00316d04;
  __n_01 = (local_148.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_len;
  uVar1 = __n_01 - 3;
  if (uVar1 < 0xd) {
    __s1 = (ulong *)(local_148.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_str;
    switch(uVar1) {
    case 0:
      iVar5 = bcmp(__s1,"log",__n_01);
      if (iVar5 == 0) {
        psVar7 = ActionMessage::getString_abi_cxx11_(command,1);
        uVar1 = (command->payload).bufferSize;
        if (uVar1 < 4) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     4,uVar1);
        }
        message._M_len = uVar1 - 4;
        message._M_str = (command->payload).heap + 4;
        logMessageSource._M_str = (psVar7->_M_dataplus)._M_p;
        logMessageSource._M_len = psVar7->_M_string_length;
        logMessage(this,6,logMessageSource,message,false);
        goto LAB_00316d04;
      }
      if (__n_01 == 5) goto switchD_003169c0_caseD_2;
      if (__n_01 == 3) {
        if (((0x20 < (ulong)((long)pbVar4 - (long)pbVar3)) &&
            (*(char *)((long)__s1 + 2) == 't' && (short)*__s1 == 0x6573)) &&
           ((pbVar3[1]._M_len == 7 &&
            (*(int *)((long)pbVar3[1]._M_str + 3) == 0x72656972 &&
             *(int *)pbVar3[1]._M_str == 0x72726162)))) {
          ActionMessage::ActionMessage(&local_100,cmd_time_barrier);
          local_100.dest_id.gid = (this->global_id)._M_i.gid;
          V._M_str = extraout_RDX;
          V._M_len = (size_t)local_148.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
          dVar10 = gmlc::utilities::numeric_conversionComplete<double>
                             ((utilities *)
                              local_148.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_len,V,0.0);
          local_100.actionTime.internalTimeCode = 0x7fffffffffffffff;
          if (dVar10 <= -9223372036.854765) {
            local_100.actionTime.internalTimeCode = -0x7fffffffffffffff;
          }
          else if (dVar10 < 9223372036.854765) {
            local_100.actionTime.internalTimeCode =
                 (baseType)
                 (dVar10 * 1000000000.0 +
                 *(double *)(&DAT_0041eab0 + (ulong)(0.0 <= dVar10 * 1000000000.0) * 8));
          }
          if (0x30 < (ulong)((long)local_148.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_148.
                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            V_02._M_str = (char *)0x0;
            V_02._M_len = (size_t)local_148.
                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[3]._M_str;
            local_100.messageID =
                 gmlc::utilities::numeric_conversionComplete<int>
                           ((utilities *)
                            local_148.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[3]._M_len,V_02,
                            (int)((long)local_148.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
          }
          gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>
          ::push<helics::ActionMessage&>
                    ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                     &this->queue,&local_100);
          goto LAB_003170a3;
        }
      }
      break;
    case 1:
      iVar5 = bcmp(__s1,"halt",__n_01);
      if (iVar5 == 0) {
LAB_00316d2b:
        if (this->mAllowRemoteControl == true) {
          if (this->mParent == (CommonCore *)0x0) goto LAB_00316d04;
          ActionMessage::ActionMessage(&local_100,cmd_disconnect);
          local_100.source_id.gid = (this->global_id)._M_i.gid;
          local_100.dest_id.gid = local_100.source_id.gid;
          BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_100);
        }
        else {
          if (this->mParent == (CommonCore *)0x0) goto LAB_00316d04;
          ActionMessage::ActionMessage(&local_100,command->messageAction);
          local_48 = (this->name)._M_dataplus._M_p;
          sStack_40 = (this->name)._M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x28;
          args_00.field_1.values_ = aVar9.values_;
          args_00.desc_ = (unsigned_long_long)&local_48;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_130,(v11 *)"log {} does not allow remote termination",fmt_00,args_00);
          __src._M_p = local_130._M_dataplus._M_p;
          if ((byte *)local_130._M_dataplus._M_p == local_100.payload.heap) {
            local_100.payload.bufferSize = local_130._M_string_length;
          }
          else {
            SmallBuffer::reserve(&local_100.payload,local_130._M_string_length);
            local_100.payload.bufferSize = local_130._M_string_length;
            if (local_130._M_string_length != 0) {
              memcpy(local_100.payload.heap,__src._M_p,local_130._M_string_length);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          local_100.dest_id.gid = (command->source_id).gid;
          local_100.source_id.gid = (this->global_id)._M_i.gid;
          psVar7 = ActionMessage::getString_abi_cxx11_(command,1);
          str_03._M_str = (psVar7->_M_dataplus)._M_p;
          str_03._M_len = psVar7->_M_string_length;
          ActionMessage::setString(&local_100,0,str_03);
          str_04._M_str = (this->name)._M_dataplus._M_p;
          str_04._M_len = (this->name)._M_string_length;
          ActionMessage::setString(&local_100,1,str_04);
          BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_100);
        }
        goto LAB_003170a3;
      }
      if ((int)*__s1 == 0x6f686365) {
        if (this->mParent == (CommonCore *)0x0) goto LAB_00316d04;
        ActionMessage::ActionMessage(&local_100,command->messageAction);
        SmallBuffer::operator=(&local_100.payload,(char (*) [11])"echo_reply");
        local_100.dest_id.gid = (command->source_id).gid;
        local_100.source_id.gid = (this->global_id)._M_i.gid;
        psVar7 = ActionMessage::getString_abi_cxx11_(command,1);
        str._M_str = (psVar7->_M_dataplus)._M_p;
        str._M_len = psVar7->_M_string_length;
        ActionMessage::setString(&local_100,0,str);
        str_00._M_str = (this->name)._M_dataplus._M_p;
        str_00._M_len = (this->name)._M_string_length;
        ActionMessage::setString(&local_100,1,str_00);
        BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_100);
        goto LAB_003170a3;
      }
      break;
    case 2:
switchD_003169c0_caseD_2:
      iVar5 = bcmp(__s1,"clear",__n_01);
      if ((((0x10 < (ulong)((long)pbVar4 - (long)pbVar3)) && (iVar5 == 0)) &&
          (pbVar3[1]._M_len == 7)) &&
         (*(int *)((long)pbVar3[1]._M_str + 3) == 0x72656972 &&
          *(int *)pbVar3[1]._M_str == 0x72726162)) {
        ActionMessage::ActionMessage(&local_100,cmd_time_barrier_clear);
        local_100.dest_id.gid = (this->global_id)._M_i.gid;
        if (0x20 < (ulong)((long)local_148.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_148.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          V_00._M_str = (char *)0x0;
          V_00._M_len = (size_t)local_148.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
          local_100.messageID =
               gmlc::utilities::numeric_conversionComplete<int>
                         ((utilities *)
                          local_148.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_len,V_00,
                          (int)((long)local_148.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_148.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        }
        gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
        push<helics::ActionMessage&>
                  ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                   &this->queue,&local_100);
LAB_003170a3:
        ActionMessage::~ActionMessage(&local_100);
        goto LAB_00316d04;
      }
      break;
    case 6:
      uVar8 = (ulong)(byte)__s1[1] ^ 0x65 | *__s1 ^ 0x74616e696d726574;
      if (uVar8 == 0) goto LAB_00316d2b;
      iVar5 = bcmp(__s1,"logbuffer",__n_01);
      if (iVar5 == 0) {
        if (0x10 < (ulong)((long)local_148.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3)) {
          if (((utilities *)pbVar3[1]._M_len != (utilities *)0x4) ||
             (*(int *)pbVar3[1]._M_str != 0x706f7473)) {
            pLVar2 = (this->mLogManager)._M_t.
                     super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                     .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl;
            V_01._M_str = (char *)0xa;
            V_01._M_len = (size_t)pbVar3[1]._M_str;
            uVar8 = gmlc::utilities::numeric_conversion<unsigned_long>
                              ((utilities *)pbVar3[1]._M_len,V_01,uVar8);
            LogBuffer::resize(&pLVar2->mLogBuffer,uVar8);
            goto LAB_00316d04;
          }
        }
        LogBuffer::enable(&((this->mLogManager)._M_t.
                            super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                            .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->
                           mLogBuffer,
                          (ulong)((long)local_148.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) <
                          0x11);
        goto LAB_00316d04;
      }
      if ((uVar1 >> 1 | (ulong)((uVar1 & 1) != 0) << 0x3f) < 7) {
        (*(code *)(&DAT_0044c514 + *(int *)(&DAT_0044c514 + (uVar1 >> 1) * 4)))();
        return;
      }
      break;
    case 0xb:
      iVar5 = bcmp(__s1,"command_status",__n_01);
      if (iVar5 == 0) {
        if (this->mParent == (CommonCore *)0x0) goto LAB_00316d04;
        ActionMessage::ActionMessage(&local_100,command->messageAction);
        local_48 = (pointer)gmlc::containers::
                            BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
                            ::size(&this->commandQueue);
        fmt.size_ = 4;
        fmt.data_ = (char *)0x19;
        args.field_1.args_ = aVar9.args_;
        args.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v11::vformat_abi_cxx11_(&local_130,(v11 *)"\"{} unprocessed commands\"",fmt,args);
        SmallBuffer::operator=(&local_100.payload,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        local_100.dest_id.gid = (command->source_id).gid;
        local_100.source_id.gid = (this->global_id)._M_i.gid;
        psVar7 = ActionMessage::getString_abi_cxx11_(command,1);
        str_01._M_str = (psVar7->_M_dataplus)._M_p;
        str_01._M_len = psVar7->_M_string_length;
        ActionMessage::setString(&local_100,0,str_01);
        str_02._M_str = (this->name)._M_dataplus._M_p;
        str_02._M_len = (this->name)._M_string_length;
        ActionMessage::setString(&local_100,1,str_02);
        BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_100);
        goto LAB_003170a3;
      }
      if ((uVar1 >> 1 | (ulong)((uVar1 & 1) != 0) << 0x3f) < 7) {
        (*(code *)(&DAT_0044c4f8 + *(int *)(&DAT_0044c4f8 + (uVar1 >> 1) * 4)))();
        return;
      }
      break;
    case 0xc:
      iVar5 = bcmp(__s1,"timeout_monitor",__n_01);
      if (iVar5 == 0) {
        setProperty(this,0xa1,(Time)(command->actionTime).internalTimeCode);
        goto LAB_00316d04;
      }
    }
  }
  psVar7 = ActionMessage::getString_abi_cxx11_(command,1);
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::string,std::__cxx11::string>,std::mutex,std::condition_variable>
  ::emplace<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&>
            ((BlockingQueue<std::pair<std::__cxx11::string,std::__cxx11::string>,std::mutex,std::condition_variable>
              *)&this->commandQueue,&local_110,psVar7);
LAB_00316d04:
  if (local_148.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FederateState::sendCommand(ActionMessage& command)
{
    auto cmd = command.payload.to_string();
    auto commentLoc = cmd.find('#');
    if (commentLoc != std::string_view::npos) {
        cmd = cmd.substr(0, commentLoc - 1);
    }
    gmlc::utilities::string_viewOps::trimString(cmd);
    auto res = gmlc::utilities::string_viewOps::splitlineQuotes(
        cmd,
        " ",
        gmlc::utilities::string_viewOps::default_quote_chars,
        gmlc::utilities::string_viewOps::delimiter_compression::on);
    if (res.empty()) {
        return;
    }

    if (res[0] == "terminate" || res[0] == "halt") {
        if (mAllowRemoteControl) {
            if (mParent != nullptr) {
                ActionMessage bye(CMD_DISCONNECT);
                bye.source_id = global_id.load();
                bye.dest_id = bye.source_id;
                mParent->addActionMessage(bye);
            }
        } else {
            if (mParent != nullptr) {
                ActionMessage response(command.action());
                response.payload =
                    fmt::format("log {} does not allow remote termination", getIdentifier());
                response.dest_id = command.source_id;
                response.source_id = global_id.load();
                response.setString(targetStringLoc, command.getString(sourceStringLoc));
                response.setString(sourceStringLoc, getIdentifier());

                mParent->addActionMessage(std::move(response));
            }
        }
    } else if (res[0] == "echo") {
        if (mParent != nullptr) {
            ActionMessage response(command.action());
            response.payload = "echo_reply";
            response.dest_id = command.source_id;
            response.source_id = global_id.load();
            response.setString(targetStringLoc, command.getString(sourceStringLoc));
            response.setString(sourceStringLoc, getIdentifier());

            mParent->addActionMessage(std::move(response));
        }
    } else if (res[0] == "command_status") {
        if (mParent != nullptr) {
            ActionMessage response(command.action());
            response.payload = fmt::format("\"{} unprocessed commands\"", commandQueue.size());
            response.dest_id = command.source_id;
            response.source_id = global_id.load();
            response.setString(targetStringLoc, command.getString(sourceStringLoc));
            response.setString(sourceStringLoc, getIdentifier());

            mParent->addActionMessage(std::move(response));
        }
    } else if (res[0] == "logbuffer") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->getLogBuffer().enable(false);
            } else {
                mLogManager->getLogBuffer().resize(gmlc::utilities::numeric_conversion<std::size_t>(
                    res[1], LogBuffer::cDefaultBufferSize));
            }
        } else {
            mLogManager->getLogBuffer().enable(true);
        }
    } else if (res[0] == "remotelog") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->updateRemote(command.source_id, HELICS_LOG_LEVEL_NO_PRINT);
            } else {
                int newLevel{HELICS_LOG_LEVEL_NO_PRINT};
                if (isdigit(res[1][0]) != 0) {
                    newLevel =
                        gmlc::utilities::numeric_conversion<int>(res[1],
                                                                 mLogManager->getConsoleLevel());
                } else {
                    newLevel = logLevelFromString(res[1]);
                }
                mLogManager->updateRemote(command.source_id, newLevel);
            }
        } else {
            mLogManager->updateRemote(command.source_id, mLogManager->getConsoleLevel());
        }
        maxLogLevel = mLogManager->getMaxLevel();
    } else if (res[0] == "timeout_monitor") {
        setProperty(defs::Properties::GRANT_TIMEOUT, command.actionTime);
    } else if (res[0] == "log") {
        logMessage(HELICS_LOG_LEVEL_SUMMARY,
                   command.getString(sourceStringLoc),
                   command.payload.to_string().substr(4));
    } else if ((res[0] == "set") && (res.size() > 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER);
        barrier.dest_id = global_id;
        barrier.actionTime = gmlc::utilities::numeric_conversionComplete<double>(res[2], 0.0);
        if (res.size() >= 4) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[3], 0);
        }

        queue.push(barrier);
    } else if ((res[0] == "clear") && (res.size() >= 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER_CLEAR);
        barrier.dest_id = global_id;
        if (res.size() >= 3) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[2], 0);
        }
        queue.push(barrier);
    } else {
        commandQueue.emplace(cmd, command.getString(sourceStringLoc));
    }
}